

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall
slang::ast::Scope::handleUserDefinedNet(Scope *this,UserDefinedNetDeclarationSyntax *syntax)

{
  undefined8 uVar1;
  Symbol *netTypeSym;
  iterator ppNVar2;
  string_view name;
  SourceRange sourceRange;
  LookupLocation location;
  NetSymbol *sym;
  iterator __end2;
  iterator __begin2;
  SmallVector<const_slang::ast::NetSymbol_*,_5UL> *__range2;
  undefined1 local_a0 [8];
  SmallVector<const_slang::ast::NetSymbol_*,_5UL> results;
  undefined4 uStack_40;
  Symbol *symbol;
  UserDefinedNetDeclarationSyntax *pUStack_18;
  DeferredMemberIndex savedIndex;
  UserDefinedNetDeclarationSyntax *syntax_local;
  Scope *this_local;
  
  symbol._0_4_ = 0;
  pUStack_18 = syntax;
  syntax_local = (UserDefinedNetDeclarationSyntax *)this;
  symbol._4_4_ = std::
                 exchange<slang::ast::Scope::DeferredMemberIndex,slang::ast::Scope::DeferredMemberIndex>
                           (&this->deferredMemberIndex,(DeferredMemberIndex *)&symbol);
  name = parsing::Token::valueText(&pUStack_18->netType);
  uVar1 = LookupLocation::max;
  uStack_40 = (undefined4)DAT_0091b918;
  sourceRange = parsing::Token::range(&pUStack_18->netType);
  bitmask<slang::ast::LookupFlags>::bitmask
            ((bitmask<slang::ast::LookupFlags> *)(results.stackBase + 0x1c),None);
  location.index = uStack_40;
  location.scope = (Scope *)uVar1;
  location._12_4_ = 0;
  netTypeSym = Lookup::unqualifiedAt
                         (this,name,location,sourceRange,
                          (bitmask<slang::ast::LookupFlags>)results.stackBase._28_4_);
  this->deferredMemberIndex = symbol._4_4_;
  SmallVector<const_slang::ast::NetSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::NetSymbol_*,_5UL> *)local_a0);
  NetSymbol::fromSyntax
            (this,pUStack_18,netTypeSym,(SmallVectorBase<const_slang::ast::NetSymbol_*> *)local_a0);
  __end2 = SmallVectorBase<const_slang::ast::NetSymbol_*>::begin
                     ((SmallVectorBase<const_slang::ast::NetSymbol_*> *)local_a0);
  ppNVar2 = SmallVectorBase<const_slang::ast::NetSymbol_*>::end
                      ((SmallVectorBase<const_slang::ast::NetSymbol_*> *)local_a0);
  for (; __end2 != ppNVar2; __end2 = __end2 + 1) {
    addMember(this,(Symbol *)*__end2);
  }
  SmallVector<const_slang::ast::NetSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::NetSymbol_*,_5UL> *)local_a0);
  return;
}

Assistant:

void Scope::handleUserDefinedNet(const UserDefinedNetDeclarationSyntax& syntax) {
    // We aren't elaborated yet so can't do a normal lookup in this scope.
    // Temporarily swap out the deferred member index so that the lookup
    // doesn't trigger elaboration.
    auto savedIndex = std::exchange(deferredMemberIndex, DeferredMemberIndex::Invalid);
    auto symbol = Lookup::unqualifiedAt(*this, syntax.netType.valueText(), LookupLocation::max,
                                        syntax.netType.range());
    deferredMemberIndex = savedIndex;

    SmallVector<const NetSymbol*> results;
    NetSymbol::fromSyntax(*this, syntax, symbol, results);
    for (auto sym : results)
        addMember(*sym);
}